

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelinePushConstantTests.cpp
# Opt level: O2

TestInstance * __thiscall
vkt::pipeline::anon_unknown_1::PushConstantComputeTest::createInstance
          (PushConstantComputeTest *this,Context *context)

{
  Context **ppCVar1;
  ProgramCollection<vk::ProgramBinary> *this_00;
  Context *pCVar2;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  Location *this_01;
  Context **ppCVar3;
  Context **ppCVar4;
  VkResult VVar5;
  TestInstance *pTVar6;
  DeviceInterface *vk;
  VkDevice device;
  InstanceInterface *vk_00;
  VkPhysicalDevice physicalDevice;
  DescriptorSetLayoutBuilder *this_02;
  DescriptorPoolBuilder *this_03;
  DescriptorSetUpdateBuilder *this_04;
  ProgramBinary *binary;
  undefined8 in_stack_fffffffffffffa58;
  undefined4 in_stack_fffffffffffffa60;
  undefined4 in_stack_fffffffffffffa64;
  VkDescriptorSetAllocateInfo allocInfo;
  VkBufferCreateInfo bufferCreateInfo;
  deUint32 queueFamilyIndex;
  Location *local_518;
  Context **local_510;
  Context **local_508;
  Context **local_500;
  Context **local_4f8;
  Context **local_4f0;
  Context **local_4e8;
  Context **local_4e0;
  Context **local_4d8;
  Context **local_4d0;
  RefBase<vk::Handle<(vk::HandleType)22>_> local_4c8;
  _func_int **local_4a8;
  deUint32 local_4a0;
  RefBase<vk::Handle<(vk::HandleType)16>_> local_498;
  VkDescriptorBufferInfo descriptorInfo;
  VkPipelineLayoutCreateInfo pipelineLayoutParams;
  SimpleAllocator memAlloc;
  
  pTVar6 = (TestInstance *)operator_new(0x178);
  pCVar2 = *(Context **)&(this->m_pushConstantRange).range.size;
  pTVar6[1]._vptr_TestInstance = *(_func_int ***)&(this->m_pushConstantRange).range;
  pTVar6[1].m_context = pCVar2;
  *(deUint32 *)&pTVar6[2]._vptr_TestInstance = (this->m_pushConstantRange).update.size;
  pTVar6->m_context = context;
  pTVar6->_vptr_TestInstance = (_func_int **)&PTR__PushConstantComputeTestInstance_00bcdab8;
  local_510 = &pTVar6[2].m_context;
  local_4d0 = &pTVar6[4].m_context;
  local_4f0 = &pTVar6[5].m_context;
  local_508 = &pTVar6[7].m_context;
  local_4f8 = &pTVar6[9].m_context;
  local_518 = (Location *)&pTVar6[0xb].m_context;
  local_500 = &pTVar6[0xd].m_context;
  local_4d8 = &pTVar6[0xf].m_context;
  local_4e0 = &pTVar6[0x11].m_context;
  ppCVar1 = &pTVar6[0x13].m_context;
  local_4e8 = &pTVar6[0x15].m_context;
  pTVar6[2].m_context = (Context *)0x0;
  pTVar6[3]._vptr_TestInstance = (_func_int **)0x0;
  pTVar6[3].m_context = (Context *)0x0;
  pTVar6[4]._vptr_TestInstance = (_func_int **)0x0;
  pTVar6[4].m_context = (Context *)0x0;
  memset(local_4f0,0,0x120);
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  vk_00 = Context::getInstanceInterface(context);
  physicalDevice = Context::getPhysicalDevice(context);
  ::vk::getPhysicalDeviceMemoryProperties
            ((VkPhysicalDeviceMemoryProperties *)&pipelineLayoutParams,vk_00,physicalDevice);
  ::vk::SimpleAllocator::SimpleAllocator
            (&memAlloc,vk,device,(VkPhysicalDeviceMemoryProperties *)&pipelineLayoutParams);
  local_4a8 = pTVar6[1]._vptr_TestInstance;
  local_4a0 = *(deUint32 *)&pTVar6[1].m_context;
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&pipelineLayoutParams);
  ppCVar4 = local_4f0;
  this_02 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      ((DescriptorSetLayoutBuilder *)&pipelineLayoutParams,
                       VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,0x20);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&allocInfo,this_02,vk,device,0);
  ppCVar3 = local_508;
  bufferCreateInfo._16_8_ = allocInfo.descriptorPool.m_internal;
  bufferCreateInfo.size = allocInfo._24_8_;
  bufferCreateInfo.sType = allocInfo.sType;
  bufferCreateInfo._4_4_ = allocInfo._4_4_;
  bufferCreateInfo.pNext = allocInfo.pNext;
  allocInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  allocInfo._4_4_ = 0;
  allocInfo.pNext = (void *)0x0;
  allocInfo.descriptorPool.m_internal = 0;
  allocInfo.descriptorSetCount = 0;
  allocInfo._28_4_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::reset
            ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_508);
  ppCVar3[2] = (Context *)bufferCreateInfo._16_8_;
  ppCVar3[3] = (Context *)bufferCreateInfo.size;
  *ppCVar3 = (Context *)bufferCreateInfo._0_8_;
  ppCVar3[1] = (Context *)bufferCreateInfo.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)19>_> *)&allocInfo);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&pipelineLayoutParams);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&allocInfo);
  this_03 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&allocInfo,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&bufferCreateInfo,this_03,vk,device,1,1);
  pipelineLayoutParams.flags = bufferCreateInfo.flags;
  pipelineLayoutParams.setLayoutCount = bufferCreateInfo._20_4_;
  pipelineLayoutParams.pSetLayouts = (VkDescriptorSetLayout *)bufferCreateInfo.size;
  pipelineLayoutParams.sType = bufferCreateInfo.sType;
  pipelineLayoutParams._4_4_ = bufferCreateInfo._4_4_;
  pipelineLayoutParams.pNext = bufferCreateInfo.pNext;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.size = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::reset
            ((RefBase<vk::Handle<(vk::HandleType)21>_> *)ppCVar4);
  ppCVar4[2] = (Context *)pipelineLayoutParams._16_8_;
  ppCVar4[3] = (Context *)pipelineLayoutParams.pSetLayouts;
  *ppCVar4 = (Context *)pipelineLayoutParams._0_8_;
  ppCVar4[1] = (Context *)pipelineLayoutParams.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)21>_> *)&bufferCreateInfo);
  std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
  ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *
                )&allocInfo);
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo._16_8_ = bufferCreateInfo._16_8_ & 0xffffffff00000000;
  bufferCreateInfo.size = 0x80;
  bufferCreateInfo.usage = 0x20;
  bufferCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  bufferCreateInfo.queueFamilyIndexCount = 1;
  bufferCreateInfo.pQueueFamilyIndices = &queueFamilyIndex;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&allocInfo,vk,device,&bufferCreateInfo,
                     (VkAllocationCallbacks *)0x0);
  ppCVar3 = local_510;
  pipelineLayoutParams.flags = (undefined4)allocInfo.descriptorPool.m_internal;
  pipelineLayoutParams.setLayoutCount = allocInfo.descriptorPool.m_internal._4_4_;
  pipelineLayoutParams.pSetLayouts = (VkDescriptorSetLayout *)allocInfo._24_8_;
  pipelineLayoutParams.sType = allocInfo.sType;
  pipelineLayoutParams._4_4_ = allocInfo._4_4_;
  pipelineLayoutParams.pNext = allocInfo.pNext;
  allocInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  allocInfo._4_4_ = 0;
  allocInfo.pNext = (void *)0x0;
  allocInfo.descriptorPool.m_internal = 0;
  allocInfo.descriptorSetCount = 0;
  allocInfo._28_4_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::reset
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_510);
  ppCVar3[2] = (Context *)pipelineLayoutParams._16_8_;
  ppCVar3[3] = (Context *)pipelineLayoutParams.pSetLayouts;
  *ppCVar3 = (Context *)pipelineLayoutParams._0_8_;
  ppCVar3[1] = (Context *)pipelineLayoutParams.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&allocInfo);
  ::vk::getBufferMemoryRequirements
            ((VkMemoryRequirements *)&pipelineLayoutParams,vk,device,(VkBuffer)*ppCVar3);
  ::vk::SimpleAllocator::allocate
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&allocInfo,&memAlloc,
             (VkMemoryRequirements *)&pipelineLayoutParams,(MemoryRequirement)0x1);
  ppCVar4 = local_4d0;
  ppCVar3 = local_4f8;
  allocInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  allocInfo._4_4_ = 0;
  data._8_4_ = in_stack_fffffffffffffa60;
  data.ptr = (Allocation *)in_stack_fffffffffffffa58;
  data._12_4_ = in_stack_fffffffffffffa64;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_4d0,data);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&allocInfo);
  VVar5 = (*vk->_vptr_DeviceInterface[0xc])
                    (vk,device,*local_510,(*ppCVar4)->m_platformInterface,
                     (*ppCVar4)->m_progCollection);
  ::vk::checkResult(VVar5,
                    "vk.bindBufferMemory(vkDevice, *m_outBuffer, m_outBufferAlloc->getMemory(), m_outBufferAlloc->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelinePushConstantTests.cpp"
                    ,0x596);
  allocInfo.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
  allocInfo.pNext = (void *)0x0;
  allocInfo.descriptorPool.m_internal = (deUint64)*local_4f0;
  allocInfo.descriptorSetCount = 1;
  allocInfo.pSetLayouts = (VkDescriptorSetLayout *)local_508;
  ::vk::allocateDescriptorSet
            ((Move<vk::Handle<(vk::HandleType)22>_> *)&local_4c8,vk,device,&allocInfo);
  pipelineLayoutParams._16_8_ = local_4c8.m_data.deleter.m_device;
  pipelineLayoutParams.pSetLayouts =
       (VkDescriptorSetLayout *)local_4c8.m_data.deleter.m_pool.m_internal;
  pipelineLayoutParams._0_8_ = local_4c8.m_data.object.m_internal;
  pipelineLayoutParams.pNext = local_4c8.m_data.deleter.m_deviceIface;
  local_4c8.m_data.object.m_internal._0_4_ = 0;
  local_4c8.m_data.object.m_internal._4_4_ = 0;
  local_4c8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_4c8.m_data.deleter.m_device = (VkDevice)0x0;
  local_4c8.m_data.deleter.m_pool.m_internal = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::reset
            ((RefBase<vk::Handle<(vk::HandleType)22>_> *)ppCVar3);
  ppCVar3[2] = (Context *)pipelineLayoutParams._16_8_;
  ppCVar3[3] = (Context *)pipelineLayoutParams.pSetLayouts;
  *ppCVar3 = (Context *)pipelineLayoutParams._0_8_;
  ppCVar3[1] = (Context *)pipelineLayoutParams.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase(&local_4c8);
  descriptorInfo.buffer.m_internal = (deUint64)*local_510;
  descriptorInfo.offset = 0;
  descriptorInfo.range = 0x80;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&pipelineLayoutParams);
  local_4c8.m_data.object.m_internal._0_4_ = 0;
  local_4c8.m_data.object.m_internal._4_4_ = 0;
  this_04 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      ((DescriptorSetUpdateBuilder *)&pipelineLayoutParams,(VkDescriptorSet)*ppCVar3
                       ,(Location *)&local_4c8,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,&descriptorInfo);
  ::vk::DescriptorSetUpdateBuilder::update(this_04,vk,device);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&pipelineLayoutParams);
  this_01 = local_518;
  pipelineLayoutParams.sType = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
  pipelineLayoutParams.pNext = (void *)0x0;
  pipelineLayoutParams.flags = 0;
  pipelineLayoutParams.setLayoutCount = 1;
  pipelineLayoutParams.pSetLayouts = (VkDescriptorSetLayout *)local_508;
  pipelineLayoutParams.pushConstantRangeCount = 1;
  pipelineLayoutParams.pPushConstantRanges = (VkPushConstantRange *)&local_4a8;
  ::vk::createPipelineLayout
            ((Move<vk::Handle<(vk::HandleType)16>_> *)&local_498,vk,device,&pipelineLayoutParams,
             (VkAllocationCallbacks *)0x0);
  local_4c8.m_data.deleter.m_device = local_498.m_data.deleter.m_device;
  local_4c8.m_data.deleter.m_pool.m_internal = (deUint64)local_498.m_data.deleter.m_allocator;
  local_4c8.m_data.object.m_internal = local_498.m_data.object.m_internal;
  local_4c8.m_data.deleter.m_deviceIface = local_498.m_data.deleter.m_deviceIface;
  local_498.m_data.object.m_internal = 0;
  local_498.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_498.m_data.deleter.m_device = (VkDevice)0x0;
  local_498.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::reset
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)this_01);
  this_01[2] = (Location)local_4c8.m_data.deleter.m_device;
  this_01[3].m_binding = (undefined4)local_4c8.m_data.deleter.m_pool.m_internal;
  this_01[3].m_arrayElement = local_4c8.m_data.deleter.m_pool.m_internal._4_4_;
  this_01->m_binding = (undefined4)local_4c8.m_data.object.m_internal;
  this_01->m_arrayElement = local_4c8.m_data.object.m_internal._4_4_;
  this_01[1] = (Location)local_4c8.m_data.deleter.m_deviceIface;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase(&local_498);
  this_00 = pTVar6->m_context->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&allocInfo,"compute",(allocator<char> *)&local_4c8);
  ppCVar3 = local_4d8;
  binary = ::vk::ProgramCollection<vk::ProgramBinary>::get(this_00,(string *)&allocInfo);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&bufferCreateInfo,vk,device,binary,0);
  pipelineLayoutParams.flags = bufferCreateInfo.flags;
  pipelineLayoutParams.setLayoutCount = bufferCreateInfo._20_4_;
  pipelineLayoutParams.pSetLayouts = (VkDescriptorSetLayout *)bufferCreateInfo.size;
  pipelineLayoutParams.sType = bufferCreateInfo.sType;
  pipelineLayoutParams._4_4_ = bufferCreateInfo._4_4_;
  pipelineLayoutParams.pNext = bufferCreateInfo.pNext;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.size = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::reset
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)ppCVar3);
  ppCVar3[2] = (Context *)pipelineLayoutParams._16_8_;
  ppCVar3[3] = (Context *)pipelineLayoutParams.pSetLayouts;
  *ppCVar3 = (Context *)pipelineLayoutParams._0_8_;
  ppCVar3[1] = (Context *)pipelineLayoutParams.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&bufferCreateInfo);
  std::__cxx11::string::~string((string *)&allocInfo);
  pipelineLayoutParams.sType = VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO;
  pipelineLayoutParams.pNext = (void *)0x0;
  pipelineLayoutParams._16_8_ = pipelineLayoutParams._16_8_ & 0xffffffff00000000;
  pipelineLayoutParams.pSetLayouts =
       (VkDescriptorSetLayout *)CONCAT44(pipelineLayoutParams.pSetLayouts._4_4_,0x12);
  pipelineLayoutParams.pushConstantRangeCount = 0;
  pipelineLayoutParams._36_4_ = 0;
  pipelineLayoutParams.pPushConstantRanges = (VkPushConstantRange *)0x2000000000;
  ::vk::createComputePipeline
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&allocInfo,vk,device,(VkPipelineCache)0x0,
             (VkComputePipelineCreateInfo *)&pipelineLayoutParams,(VkAllocationCallbacks *)0x0);
  ppCVar3 = local_500;
  bufferCreateInfo._16_8_ = allocInfo.descriptorPool.m_internal;
  bufferCreateInfo.size = allocInfo._24_8_;
  bufferCreateInfo.sType = allocInfo.sType;
  bufferCreateInfo._4_4_ = allocInfo._4_4_;
  bufferCreateInfo.pNext = allocInfo.pNext;
  allocInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  allocInfo._4_4_ = 0;
  allocInfo.pNext = (void *)0x0;
  allocInfo.descriptorPool.m_internal = 0;
  allocInfo.descriptorSetCount = 0;
  allocInfo._28_4_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::reset
            ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_500);
  ppCVar3[2] = (Context *)bufferCreateInfo._16_8_;
  ppCVar3[3] = (Context *)bufferCreateInfo.size;
  *ppCVar3 = (Context *)bufferCreateInfo._0_8_;
  ppCVar3[1] = (Context *)bufferCreateInfo.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&allocInfo);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&bufferCreateInfo,vk,device,1,queueFamilyIndex
             ,(VkAllocationCallbacks *)0x0);
  ppCVar3 = local_4e0;
  pipelineLayoutParams.flags = bufferCreateInfo.flags;
  pipelineLayoutParams.setLayoutCount = bufferCreateInfo._20_4_;
  pipelineLayoutParams.pSetLayouts = (VkDescriptorSetLayout *)bufferCreateInfo.size;
  pipelineLayoutParams.sType = bufferCreateInfo.sType;
  pipelineLayoutParams._4_4_ = bufferCreateInfo._4_4_;
  pipelineLayoutParams.pNext = bufferCreateInfo.pNext;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.size = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::reset
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_4e0);
  ppCVar3[2] = (Context *)pipelineLayoutParams._16_8_;
  ppCVar3[3] = (Context *)pipelineLayoutParams.pSetLayouts;
  *ppCVar3 = (Context *)pipelineLayoutParams._0_8_;
  ppCVar3[1] = (Context *)pipelineLayoutParams.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&bufferCreateInfo);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&bufferCreateInfo,vk,device,(VkCommandPool)*ppCVar3,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  pipelineLayoutParams.flags = bufferCreateInfo.flags;
  pipelineLayoutParams.setLayoutCount = bufferCreateInfo._20_4_;
  pipelineLayoutParams.pSetLayouts = (VkDescriptorSetLayout *)bufferCreateInfo.size;
  pipelineLayoutParams.sType = bufferCreateInfo.sType;
  pipelineLayoutParams._4_4_ = bufferCreateInfo._4_4_;
  pipelineLayoutParams.pNext = bufferCreateInfo.pNext;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.size = 0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::reset
            ((RefBase<vk::VkCommandBuffer_s_*> *)ppCVar1);
  pTVar6[0x14].m_context = (Context *)pipelineLayoutParams._16_8_;
  pTVar6[0x15]._vptr_TestInstance = (_func_int **)pipelineLayoutParams.pSetLayouts;
  *ppCVar1 = (Context *)pipelineLayoutParams._0_8_;
  pTVar6[0x14]._vptr_TestInstance = (_func_int **)pipelineLayoutParams.pNext;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&bufferCreateInfo);
  pipelineLayoutParams.flags = 0;
  pipelineLayoutParams.setLayoutCount = 0;
  pipelineLayoutParams.pSetLayouts = (VkDescriptorSetLayout *)0x0;
  pipelineLayoutParams.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
  pipelineLayoutParams._4_4_ = 0;
  pipelineLayoutParams.pNext = (void *)0x0;
  VVar5 = (*vk->_vptr_DeviceInterface[0x49])(vk,*ppCVar1,&pipelineLayoutParams);
  ::vk::checkResult(VVar5,"vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelinePushConstantTests.cpp"
                    ,0x5e4);
  (*vk->_vptr_DeviceInterface[0x4c])(vk,*ppCVar1,1,*local_500);
  (*vk->_vptr_DeviceInterface[0x56])(vk,*ppCVar1,1,*local_518,0,1,local_4f8,0,0);
  bufferCreateInfo.sType = 0x3f800000;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x3f80000000000000;
  (*vk->_vptr_DeviceInterface[0x73])
            (vk,pTVar6[0x13].m_context,pTVar6[0xb].m_context,
             (ulong)*(uint *)&pTVar6[1]._vptr_TestInstance,
             (ulong)*(uint *)((long)&pTVar6[1]._vptr_TestInstance + 4),
             (ulong)*(uint *)&pTVar6[1].m_context,&bufferCreateInfo);
  (*vk->_vptr_DeviceInterface[0x5d])(vk,*ppCVar1,8);
  VVar5 = (*vk->_vptr_DeviceInterface[0x4a])(vk,*ppCVar1);
  ::vk::checkResult(VVar5,"vk.endCommandBuffer(*m_cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelinePushConstantTests.cpp"
                    ,0x5ef);
  ppCVar1 = local_4e8;
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&bufferCreateInfo,vk,device,0,
                    (VkAllocationCallbacks *)0x0);
  pipelineLayoutParams.flags = bufferCreateInfo.flags;
  pipelineLayoutParams.setLayoutCount = bufferCreateInfo._20_4_;
  pipelineLayoutParams.pSetLayouts = (VkDescriptorSetLayout *)bufferCreateInfo.size;
  pipelineLayoutParams.sType = bufferCreateInfo.sType;
  pipelineLayoutParams._4_4_ = bufferCreateInfo._4_4_;
  pipelineLayoutParams.pNext = bufferCreateInfo.pNext;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.size = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::reset
            ((RefBase<vk::Handle<(vk::HandleType)6>_> *)ppCVar1);
  ppCVar1[2] = (Context *)pipelineLayoutParams._16_8_;
  ppCVar1[3] = (Context *)pipelineLayoutParams.pSetLayouts;
  *ppCVar1 = (Context *)pipelineLayoutParams._0_8_;
  ppCVar1[1] = (Context *)pipelineLayoutParams.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)6>_> *)&bufferCreateInfo);
  return pTVar6;
}

Assistant:

TestInstance* PushConstantComputeTest::createInstance (Context& context) const
{
	return new PushConstantComputeTestInstance(context, m_pushConstantRange);
}